

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O2

void dradbg(int ido,int ip,int l1,int idl1,float *cc,float *c1,float *c2,float *ch,float *ch2,
           float *wa)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  float *pfVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  float *pfVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  float *pfVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  bool bVar31;
  double dVar32;
  double dVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  
  iVar10 = ip * ido;
  iVar1 = l1 * ido;
  dVar32 = cos((double)(6.2831855 / (float)ip));
  dVar33 = sin((double)(6.2831855 / (float)ip));
  lVar2 = (long)ido;
  if (ido < l1) {
    uVar5 = 0;
    iVar8 = 0;
    if (0 < l1) {
      iVar8 = l1;
    }
    uVar9 = 0;
    pfVar6 = cc;
    pfVar24 = ch;
    if (0 < ido) {
      uVar9 = (ulong)(uint)ido;
    }
    for (; pfVar15 = pfVar24, pfVar7 = pfVar6, iVar18 = iVar8, uVar5 != uVar9; uVar5 = uVar5 + 1) {
      while (iVar18 != 0) {
        *pfVar15 = *pfVar7;
        pfVar15 = pfVar15 + lVar2;
        pfVar7 = pfVar7 + iVar10;
        iVar18 = iVar18 + -1;
      }
      pfVar6 = pfVar6 + 1;
      pfVar24 = pfVar24 + 1;
    }
  }
  else {
    iVar13 = 0;
    iVar18 = 0;
    if (0 < ido) {
      iVar18 = ido;
    }
    pfVar6 = cc;
    pfVar24 = ch;
    iVar8 = 0;
    if (0 < l1) {
      iVar8 = l1;
    }
    for (; iVar13 != iVar8; iVar13 = iVar13 + 1) {
      for (lVar3 = 0; iVar18 != (int)lVar3; lVar3 = lVar3 + 1) {
        pfVar24[lVar3] = pfVar6[lVar3];
      }
      pfVar6 = pfVar6 + iVar10;
      pfVar24 = pfVar24 + lVar2;
    }
  }
  iVar18 = ido + -1 >> 1;
  iVar13 = ip + 1 >> 1;
  iVar20 = ido * 2;
  iVar25 = iVar1 * (ip + -1);
  lVar3 = lVar2 * 4;
  pfVar6 = cc + iVar20;
  iVar26 = iVar25;
  iVar22 = iVar1;
  for (iVar16 = 1; iVar16 < iVar13; iVar16 = iVar16 + 1) {
    pfVar24 = pfVar6;
    pfVar15 = ch;
    iVar11 = iVar8;
    while (bVar31 = iVar11 != 0, iVar11 = iVar11 + -1, bVar31) {
      pfVar15[iVar22] = pfVar24[-1] + pfVar24[-1];
      pfVar15[iVar26] = *pfVar24 + *pfVar24;
      pfVar15 = pfVar15 + lVar2;
      pfVar24 = pfVar24 + iVar10;
    }
    iVar26 = iVar26 - iVar1;
    iVar22 = iVar22 + iVar1;
    pfVar6 = pfVar6 + iVar20;
  }
  if (ido != 1) {
    if (iVar18 < l1) {
      iVar22 = iVar1 + 2;
      iVar28 = iVar25 + 2;
      iVar11 = iVar20 + 2;
      iVar26 = iVar20 + -2;
      for (iVar16 = 1; iVar16 < iVar13; iVar16 = iVar16 + 1) {
        iVar4 = iVar26;
        iVar21 = iVar11;
        iVar27 = iVar22;
        iVar29 = iVar28;
        for (iVar17 = 2; iVar17 < ido; iVar17 = iVar17 + 2) {
          pfVar6 = ch;
          pfVar24 = cc;
          iVar23 = iVar8;
          while (bVar31 = iVar23 != 0, iVar23 = iVar23 + -1, bVar31) {
            pfVar6[(long)iVar27 + -1] = pfVar24[(long)iVar21 + -1] + pfVar24[(long)iVar4 + -1];
            pfVar6[(long)iVar29 + -1] = pfVar24[(long)iVar21 + -1] - pfVar24[(long)iVar4 + -1];
            pfVar6[iVar27] = pfVar24[iVar21] - pfVar24[iVar4];
            pfVar6[iVar29] = pfVar24[iVar21] + pfVar24[iVar4];
            pfVar24 = pfVar24 + iVar10;
            pfVar6 = pfVar6 + lVar2;
          }
          iVar27 = iVar27 + 2;
          iVar29 = iVar29 + 2;
          iVar21 = iVar21 + 2;
          iVar4 = iVar4 + -2;
        }
        iVar22 = iVar22 + iVar1;
        iVar28 = iVar28 - iVar1;
        iVar11 = iVar11 + iVar20;
        iVar26 = iVar26 + iVar20;
      }
    }
    else {
      iVar26 = iVar20;
      iVar22 = iVar25;
      iVar11 = iVar1;
      for (iVar16 = 1; iVar16 < iVar13; iVar16 = iVar16 + 1) {
        pfVar6 = cc + (long)iVar26 + -2;
        pfVar24 = cc + iVar26;
        pfVar15 = ch + (long)iVar22 + 2;
        pfVar7 = ch + (long)iVar11 + 2;
        for (iVar28 = 0; iVar28 != iVar8; iVar28 = iVar28 + 1) {
          pfVar19 = pfVar6;
          for (lVar14 = 0; (int)lVar14 + 2 < ido; lVar14 = lVar14 + 2) {
            pfVar7[lVar14 + -1] = pfVar24[lVar14 + 1] + pfVar19[-1];
            pfVar15[lVar14 + -1] = pfVar24[lVar14 + 1] - pfVar19[-1];
            pfVar7[lVar14] = pfVar24[lVar14 + 2] - *pfVar19;
            pfVar15[lVar14] = pfVar24[lVar14 + 2] + *pfVar19;
            pfVar19 = pfVar19 + -2;
          }
          pfVar6 = pfVar6 + iVar10;
          pfVar24 = pfVar24 + iVar10;
          pfVar15 = pfVar15 + lVar2;
          pfVar7 = pfVar7 + lVar2;
        }
        iVar11 = iVar11 + iVar1;
        iVar22 = iVar22 - iVar1;
        iVar26 = iVar26 + iVar20;
      }
    }
  }
  iVar10 = (ip + -1) * idl1;
  uVar5 = 0;
  if (0 < idl1) {
    uVar5 = (ulong)(uint)idl1;
  }
  lVar14 = (long)iVar10;
  fVar34 = 0.0;
  fVar36 = 1.0;
  iVar20 = idl1;
  for (iVar16 = 1; iVar16 < iVar13; iVar16 = iVar16 + 1) {
    fVar35 = (float)dVar32 * fVar36 - (float)dVar33 * fVar34;
    fVar34 = fVar34 * (float)dVar32 + fVar36 * (float)dVar33;
    for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
      c2[(long)iVar20 + uVar9] = ch2[(long)idl1 + uVar9] * fVar35 + ch2[uVar9];
      c2[(long)iVar10 + uVar9] = ch2[lVar14 + uVar9] * fVar34;
    }
    fVar36 = fVar34;
    fVar38 = fVar35;
    iVar11 = idl1 * 2;
    iVar22 = (ip + -2) * idl1;
    for (iVar26 = 2; iVar26 != iVar13; iVar26 = iVar26 + 1) {
      fVar37 = fVar35 * fVar38 + fVar36 * -fVar34;
      fVar36 = fVar38 * fVar34 + fVar35 * fVar36;
      for (lVar12 = 0; (int)uVar5 != (int)lVar12; lVar12 = lVar12 + 1) {
        c2[iVar20 + lVar12] = ch2[iVar11 + lVar12] * fVar37 + c2[iVar20 + lVar12];
        c2[iVar10 + lVar12] = ch2[iVar22 + lVar12] * fVar36 + c2[iVar10 + lVar12];
      }
      iVar11 = iVar11 + idl1;
      iVar22 = iVar22 - idl1;
      fVar38 = fVar37;
    }
    iVar20 = iVar20 + idl1;
    iVar10 = iVar10 - idl1;
    fVar36 = fVar35;
  }
  iVar16 = idl1;
  for (iVar10 = 1; iVar10 < iVar13; iVar10 = iVar10 + 1) {
    pfVar6 = ch2;
    uVar9 = uVar5;
    while (bVar31 = uVar9 != 0, uVar9 = uVar9 - 1, bVar31) {
      *pfVar6 = pfVar6[iVar16] + *pfVar6;
      pfVar6 = pfVar6 + 1;
    }
    iVar16 = iVar16 + idl1;
  }
  iVar16 = iVar25;
  iVar20 = iVar1;
  for (iVar10 = 1; iVar10 < iVar13; iVar10 = iVar10 + 1) {
    lVar14 = (long)iVar20;
    lVar30 = (long)iVar16;
    lVar12 = 0;
    iVar26 = iVar8;
    while (bVar31 = iVar26 != 0, iVar26 = iVar26 + -1, bVar31) {
      *(float *)((long)ch + lVar12 + lVar14 * 4) =
           *(float *)((long)c1 + lVar12 + lVar14 * 4) - *(float *)((long)c1 + lVar12 + lVar30 * 4);
      *(float *)((long)ch + lVar12 + lVar30 * 4) =
           *(float *)((long)c1 + lVar12 + lVar14 * 4) + *(float *)((long)c1 + lVar12 + lVar30 * 4);
      lVar12 = lVar12 + lVar3;
    }
    iVar16 = iVar16 - iVar1;
    iVar20 = iVar20 + iVar1;
  }
  if (ido != 1) {
    if (iVar18 < l1) {
      iVar16 = iVar1 + 2;
      iVar25 = iVar25 + 2;
      for (iVar10 = 1; iVar10 < iVar13; iVar10 = iVar10 + 1) {
        iVar26 = iVar16;
        iVar22 = iVar25;
        for (iVar20 = 2; iVar20 < ido; iVar20 = iVar20 + 2) {
          lVar14 = (long)iVar22;
          lVar12 = (long)iVar26;
          lVar30 = 0;
          iVar11 = iVar8;
          while (bVar31 = iVar11 != 0, iVar11 = iVar11 + -1, bVar31) {
            *(float *)((long)ch + lVar30 + lVar12 * 4 + -4) =
                 *(float *)((long)c1 + lVar30 + lVar12 * 4 + -4) -
                 *(float *)((long)c1 + lVar30 + lVar14 * 4);
            *(float *)((long)ch + lVar30 + lVar14 * 4 + -4) =
                 *(float *)((long)c1 + lVar30 + lVar12 * 4 + -4) +
                 *(float *)((long)c1 + lVar30 + lVar14 * 4);
            *(float *)((long)ch + lVar30 + lVar12 * 4) =
                 *(float *)((long)c1 + lVar30 + lVar12 * 4) +
                 *(float *)((long)c1 + lVar30 + lVar14 * 4 + -4);
            *(float *)((long)ch + lVar30 + lVar14 * 4) =
                 *(float *)((long)c1 + lVar30 + lVar12 * 4) -
                 *(float *)((long)c1 + lVar30 + lVar14 * 4 + -4);
            lVar30 = lVar30 + lVar3;
          }
          iVar26 = iVar26 + 2;
          iVar22 = iVar22 + 2;
        }
        iVar16 = iVar16 + iVar1;
        iVar25 = iVar25 - iVar1;
      }
    }
    else {
      iVar16 = iVar1;
      for (iVar10 = 1; iVar10 < iVar13; iVar10 = iVar10 + 1) {
        pfVar6 = ch + (long)iVar25 + 2;
        pfVar15 = c1 + (long)iVar25 + 2;
        pfVar7 = c1 + (long)iVar16 + 2;
        pfVar24 = ch + (long)iVar16 + 2;
        for (iVar20 = 0; iVar20 != iVar8; iVar20 = iVar20 + 1) {
          for (lVar14 = 0; (int)lVar14 + 2 < ido; lVar14 = lVar14 + 2) {
            pfVar24[lVar14 + -1] = pfVar7[lVar14 + -1] - pfVar15[lVar14];
            pfVar6[lVar14 + -1] = pfVar7[lVar14 + -1] + pfVar15[lVar14];
            pfVar24[lVar14] = pfVar7[lVar14] + pfVar15[lVar14 + -1];
            pfVar6[lVar14] = pfVar7[lVar14] - pfVar15[lVar14 + -1];
          }
          pfVar6 = pfVar6 + lVar2;
          pfVar15 = pfVar15 + lVar2;
          pfVar7 = pfVar7 + lVar2;
          pfVar24 = pfVar24 + lVar2;
        }
        iVar16 = iVar16 + iVar1;
        iVar25 = iVar25 - iVar1;
      }
    }
    for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
      c2[uVar9] = ch2[uVar9];
    }
    iVar13 = iVar1;
    for (iVar10 = 1; iVar10 < ip; iVar10 = iVar10 + 1) {
      lVar14 = (long)iVar13 << 2;
      iVar16 = iVar8;
      while (bVar31 = iVar16 != 0, iVar16 = iVar16 + -1, bVar31) {
        *(undefined4 *)((long)c1 + lVar14) = *(undefined4 *)((long)ch + lVar14);
        lVar14 = lVar14 + lVar3;
      }
      iVar13 = iVar13 + iVar1;
    }
    if (l1 < iVar18) {
      iVar18 = -1;
      iVar13 = iVar1;
      for (iVar10 = 1; iVar10 < ip; iVar10 = iVar10 + 1) {
        pfVar24 = ch + iVar13;
        pfVar6 = c1 + iVar13;
        for (iVar16 = 0; lVar3 = 2, iVar16 != iVar8; iVar16 = iVar16 + 1) {
          for (; (int)lVar3 < ido; lVar3 = lVar3 + 2) {
            pfVar6[lVar3 + -1] =
                 wa[(long)iVar18 + lVar3 + -1] * pfVar24[lVar3 + -1] -
                 pfVar24[lVar3] * wa[iVar18 + lVar3];
            pfVar6[lVar3] =
                 wa[(long)iVar18 + lVar3 + -1] * pfVar24[lVar3] +
                 wa[iVar18 + lVar3] * pfVar24[lVar3 + -1];
          }
          pfVar24 = pfVar24 + lVar2;
          pfVar6 = pfVar6 + lVar2;
        }
        iVar13 = iVar13 + iVar1;
        iVar18 = iVar18 + ido;
      }
    }
    else {
      iVar13 = iVar1 + 2;
      iVar18 = -1;
      for (iVar10 = 1; iVar10 < ip; iVar10 = iVar10 + 1) {
        lVar2 = (long)iVar18;
        iVar16 = iVar13;
        for (iVar20 = 2; iVar20 < ido; iVar20 = iVar20 + 2) {
          lVar12 = (long)iVar16 << 2;
          lVar14 = lVar2 + 2;
          iVar25 = iVar8;
          while (bVar31 = iVar25 != 0, iVar25 = iVar25 + -1, bVar31) {
            *(float *)((long)c1 + lVar12 + -4) =
                 wa[lVar2 + 1] * *(float *)((long)ch + lVar12 + -4) -
                 *(float *)((long)ch + lVar12) * wa[lVar14];
            *(float *)((long)c1 + lVar12) =
                 wa[lVar2 + 1] * *(float *)((long)ch + lVar12) +
                 wa[lVar14] * *(float *)((long)ch + lVar12 + -4);
            lVar12 = lVar12 + lVar3;
          }
          iVar16 = iVar16 + 2;
          lVar2 = lVar14;
        }
        iVar13 = iVar13 + iVar1;
        iVar18 = iVar18 + ido;
      }
    }
  }
  return;
}

Assistant:

static void dradbg(int ido,int ip,int l1,int idl1,float *cc,float *c1,
            float *c2,float *ch,float *ch2,float *wa){
  static float tpi=6.283185307179586f;
  int idij,ipph,i,j,k,l,ik,is,t0,t1,t2,t3,t4,t5,t6,t7,t8,t9,t10,
      t11,t12;
  float dc2,ai1,ai2,ar1,ar2,ds2;
  int nbd;
  float dcp,arg,dsp,ar1h,ar2h;
  int ipp2;

  t10=ip*ido;
  t0=l1*ido;
  arg=tpi/(float)ip;
  dcp=cos(arg);
  dsp=sin(arg);
  nbd=(ido-1)>>1;
  ipp2=ip;
  ipph=(ip+1)>>1;
  if(ido<l1)goto L103;

  t1=0;
  t2=0;
  for(k=0;k<l1;k++){
    t3=t1;
    t4=t2;
    for(i=0;i<ido;i++){
      ch[t3]=cc[t4];
      t3++;
      t4++;
    }
    t1+=ido;
    t2+=t10;
  }
  goto L106;

 L103:
  t1=0;
  for(i=0;i<ido;i++){
    t2=t1;
    t3=t1;
    for(k=0;k<l1;k++){
      ch[t2]=cc[t3];
      t2+=ido;
      t3+=t10;
    }
    t1++;
  }

 L106:
  t1=0;
  t2=ipp2*t0;
  t7=(t5=ido<<1);
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    t6=t5;
    for(k=0;k<l1;k++){
      ch[t3]=cc[t6-1]+cc[t6-1];
      ch[t4]=cc[t6]+cc[t6];
      t3+=ido;
      t4+=ido;
      t6+=t10;
    }
    t5+=t7;
  }

  if (ido == 1)goto L116;
  if(nbd<l1)goto L112;

  t1=0;
  t2=ipp2*t0;
  t7=0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;

    t7+=(ido<<1);
    t8=t7;
    for(k=0;k<l1;k++){
      t5=t3;
      t6=t4;
      t9=t8;
      t11=t8;
      for(i=2;i<ido;i+=2){
        t5+=2;
        t6+=2;
        t9+=2;
        t11-=2;
        ch[t5-1]=cc[t9-1]+cc[t11-1];
        ch[t6-1]=cc[t9-1]-cc[t11-1];
        ch[t5]=cc[t9]-cc[t11];
        ch[t6]=cc[t9]+cc[t11];
      }
      t3+=ido;
      t4+=ido;
      t8+=t10;
    }
  }
  goto L116;

 L112:
  t1=0;
  t2=ipp2*t0;
  t7=0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    t7+=(ido<<1);
    t8=t7;
    t9=t7;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4+=2;
      t8+=2;
      t9-=2;
      t5=t3;
      t6=t4;
      t11=t8;
      t12=t9;
      for(k=0;k<l1;k++){
        ch[t5-1]=cc[t11-1]+cc[t12-1];
        ch[t6-1]=cc[t11-1]-cc[t12-1];
        ch[t5]=cc[t11]-cc[t12];
        ch[t6]=cc[t11]+cc[t12];
        t5+=ido;
        t6+=ido;
        t11+=t10;
        t12+=t10;
      }
    }
  }

L116:
  ar1=1.f;
  ai1=0.f;
  t1=0;
  t9=(t2=ipp2*idl1);
  t3=(ip-1)*idl1;
  for(l=1;l<ipph;l++){
    t1+=idl1;
    t2-=idl1;

    ar1h=dcp*ar1-dsp*ai1;
    ai1=dcp*ai1+dsp*ar1;
    ar1=ar1h;
    t4=t1;
    t5=t2;
    t6=0;
    t7=idl1;
    t8=t3;
    for(ik=0;ik<idl1;ik++){
      c2[t4++]=ch2[t6++]+ar1*ch2[t7++];
      c2[t5++]=ai1*ch2[t8++];
    }
    dc2=ar1;
    ds2=ai1;
    ar2=ar1;
    ai2=ai1;

    t6=idl1;
    t7=t9-idl1;
    for(j=2;j<ipph;j++){
      t6+=idl1;
      t7-=idl1;
      ar2h=dc2*ar2-ds2*ai2;
      ai2=dc2*ai2+ds2*ar2;
      ar2=ar2h;
      t4=t1;
      t5=t2;
      t11=t6;
      t12=t7;
      for(ik=0;ik<idl1;ik++){
        c2[t4++]+=ar2*ch2[t11++];
        c2[t5++]+=ai2*ch2[t12++];
      }
    }
  }

  t1=0;
  for(j=1;j<ipph;j++){
    t1+=idl1;
    t2=t1;
    for(ik=0;ik<idl1;ik++)ch2[ik]+=ch2[t2++];
  }

  t1=0;
  t2=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    for(k=0;k<l1;k++){
      ch[t3]=c1[t3]-c1[t4];
      ch[t4]=c1[t3]+c1[t4];
      t3+=ido;
      t4+=ido;
    }
  }

  if(ido==1)goto L132;
  if(nbd<l1)goto L128;

  t1=0;
  t2=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    for(k=0;k<l1;k++){
      t5=t3;
      t6=t4;
      for(i=2;i<ido;i+=2){
        t5+=2;
        t6+=2;
        ch[t5-1]=c1[t5-1]-c1[t6];
        ch[t6-1]=c1[t5-1]+c1[t6];
        ch[t5]=c1[t5]+c1[t6-1];
        ch[t6]=c1[t5]-c1[t6-1];
      }
      t3+=ido;
      t4+=ido;
    }
  }
  goto L132;

 L128:
  t1=0;
  t2=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4+=2;
      t5=t3;
      t6=t4;
      for(k=0;k<l1;k++){
        ch[t5-1]=c1[t5-1]-c1[t6];
        ch[t6-1]=c1[t5-1]+c1[t6];
        ch[t5]=c1[t5]+c1[t6-1];
        ch[t6]=c1[t5]-c1[t6-1];
        t5+=ido;
        t6+=ido;
      }
    }
  }

L132:
  if(ido==1)return;

  for(ik=0;ik<idl1;ik++)c2[ik]=ch2[ik];

  t1=0;
  for(j=1;j<ip;j++){
    t2=(t1+=t0);
    for(k=0;k<l1;k++){
      c1[t2]=ch[t2];
      t2+=ido;
    }
  }

  if(nbd>l1)goto L139;

  is= -ido-1;
  t1=0;
  for(j=1;j<ip;j++){
    is+=ido;
    t1+=t0;
    idij=is;
    t2=t1;
    for(i=2;i<ido;i+=2){
      t2+=2;
      idij+=2;
      t3=t2;
      for(k=0;k<l1;k++){
        c1[t3-1]=wa[idij-1]*ch[t3-1]-wa[idij]*ch[t3];
        c1[t3]=wa[idij-1]*ch[t3]+wa[idij]*ch[t3-1];
        t3+=ido;
      }
    }
  }
  return;

 L139:
  is= -ido-1;
  t1=0;
  for(j=1;j<ip;j++){
    is+=ido;
    t1+=t0;
    t2=t1;
    for(k=0;k<l1;k++){
      idij=is;
      t3=t2;
      for(i=2;i<ido;i+=2){
        idij+=2;
        t3+=2;
        c1[t3-1]=wa[idij-1]*ch[t3-1]-wa[idij]*ch[t3];
        c1[t3]=wa[idij-1]*ch[t3]+wa[idij]*ch[t3-1];
      }
      t2+=ido;
    }
  }
}